

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::read_content<httplib::Response>(Stream *strm,Response *x,Progress *progress)

{
  Headers *this;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pcVar10;
  char byte;
  key_type local_80;
  Progress *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  pointer local_38;
  
  this = &x->headers;
  paVar9 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Content-Length","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this->_M_t,&local_80);
  local_60 = progress;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar9) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  p_Var1 = &(x->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
    local_80._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Transfer-Encoding","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this->_M_t,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar9) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (cVar7._M_node == cVar6._M_node) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)(cVar7._M_node + 2);
    }
    iVar3 = strcasecmp(pcVar8,"chunked");
    if (iVar3 != 0) {
      iVar3 = (*strm->_vptr_Stream[2])(strm,&local_80,1);
      if (0 < iVar3) {
        do {
          std::__cxx11::string::push_back((char)x + 'X');
          iVar3 = (*strm->_vptr_Stream[2])(strm,&local_80,1);
        } while (0 < iVar3);
      }
      return -1 < iVar3;
    }
LAB_0014d80c:
    bVar2 = read_content_chunked(strm,&x->body);
  }
  else {
    iVar3 = get_header_value_int(this,"Content-Length",0);
    if (iVar3 == 0) {
      local_80._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Transfer-Encoding","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this->_M_t,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar9) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)(cVar6._M_node + 2);
      }
      iVar4 = strcasecmp(pcVar8,"chunked");
      if (iVar4 == 0) goto LAB_0014d80c;
    }
    pcVar10 = (pointer)(long)iVar3;
    std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_58,local_60);
    std::__cxx11::string::_M_replace_aux((ulong)&x->body,0,(x->body)._M_string_length,(char)iVar3);
    bVar2 = true;
    if (iVar3 != 0) {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      do {
        uVar5 = (*strm->_vptr_Stream[2])
                          (strm,paVar9->_M_local_buf + (long)(x->body)._M_dataplus._M_p,
                           (long)pcVar10 - (long)paVar9);
        if (((int)uVar5 < 1) ||
           ((paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar9->_M_local_buf + uVar5), local_48 != (code *)0x0 &&
            (local_80._M_dataplus._M_p = (pointer)paVar9, local_38 = pcVar10,
            bVar2 = (*local_40)(&local_58,(unsigned_long *)&local_80,(unsigned_long *)&local_38),
            !bVar2)))) {
          bVar2 = false;
          goto LAB_0014d7ed;
        }
      } while (paVar9 < pcVar10);
      bVar2 = true;
    }
LAB_0014d7ed:
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  return bVar2;
}

Assistant:

bool read_content(Stream& strm, T& x, Progress progress = Progress())
{
    if (has_header(x.headers, "Content-Length")) {
        auto len = get_header_value_int(x.headers, "Content-Length", 0);
        if (len == 0) {
            const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", 0, "");
            if (!strcasecmp(encoding, "chunked")) {
                return read_content_chunked(strm, x.body);
            }
        }
        return read_content_with_length(strm, x.body, len, progress);
    } else {
        const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", 0, "");
        if (!strcasecmp(encoding, "chunked")) {
            return read_content_chunked(strm, x.body);
        }
        return read_content_without_length(strm, x.body);
    }
    return true;
}